

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O0

void duckdb::ArgMinMaxBase<duckdb::GreaterThan,true>::
     Combine<duckdb::ArgMinMaxState<duckdb::timestamp_t,double>,duckdb::ArgMinMaxBase<duckdb::GreaterThan,true>>
               (ArgMinMaxState<duckdb::timestamp_t,_double> *source,
               ArgMinMaxState<duckdb::timestamp_t,_double> *target,AggregateInputData *param_3)

{
  bool bVar1;
  undefined8 in_RDX;
  double *in_RSI;
  timestamp_t *in_RDI;
  undefined1 x_null;
  
  x_null = (undefined1)((ulong)in_RDX >> 0x38);
  if (((in_RDI->value & 1) != 0) &&
     ((((ulong)*in_RSI & 1) == 0 ||
      (bVar1 = duckdb::GreaterThan::Operation<double>((double *)(in_RDI + 2),in_RSI + 2), bVar1))))
  {
    Assign<duckdb::timestamp_t,double,duckdb::ArgMinMaxState<duckdb::timestamp_t,double>>
              ((ArgMinMaxState<duckdb::timestamp_t,_double> *)param_3,in_RDI,in_RSI,(bool)x_null);
    *(undefined1 *)in_RSI = 1;
  }
  return;
}

Assistant:

static void Combine(const STATE &source, STATE &target, AggregateInputData &) {
		if (!source.is_initialized) {
			return;
		}
		if (!target.is_initialized || COMPARATOR::Operation(source.value, target.value)) {
			Assign(target, source.arg, source.value, source.arg_null);
			target.is_initialized = true;
		}
	}